

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedMemory.cpp
# Opt level: O1

int __thiscall SharedMemory::init(SharedMemory *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  __uid_t _Var2;
  int in_ECX;
  int in_EDX;
  int __key;
  size_t __size;
  shmid_ds local_98;
  
  __key = (int)ctx;
  if (__key != -1) {
    __size = (size_t)in_EDX;
    iVar1 = 0x600;
    if (in_ECX == 0) {
      iVar1 = 0;
    }
    iVar1 = shmget(__key,__size,iVar1);
    this->mShm = iVar1;
    if (in_ECX == 2 && iVar1 == -1) {
      iVar1 = shmget(__key,__size,0);
      this->mShm = iVar1;
      if (iVar1 != -1) {
        shmctl(iVar1,0,(shmid_ds *)0x0);
        iVar1 = shmget(__key,__size,0x600);
        this->mShm = iVar1;
      }
    }
    if (this->mShm != -1) {
      if (in_ECX != 0) {
        local_98.__unused4 = 0;
        local_98.__unused5 = 0;
        local_98.shm_cpid = 0;
        local_98.shm_lpid = 0;
        local_98.shm_nattch = 0;
        local_98.shm_dtime = 0;
        local_98.shm_ctime = 0;
        local_98.shm_segsz = 0;
        local_98.shm_atime = 0;
        local_98.shm_perm.__unused1 = 0;
        local_98.shm_perm.__unused2 = 0;
        local_98.shm_perm.cgid = 0;
        local_98.shm_perm.mode = 0;
        local_98.shm_perm.__pad1 = 0;
        local_98.shm_perm.__seq = 0;
        local_98.shm_perm.__pad2 = 0;
        local_98.shm_perm._28_4_ = 0;
        local_98.shm_perm.__key = 0;
        local_98.shm_perm.uid = 0;
        local_98.shm_perm.gid = 0;
        local_98.shm_perm.cuid = 0;
        _Var2 = getuid();
        local_98.shm_perm.uid = _Var2;
        local_98.shm_perm._20_4_ = 0x380;
        iVar1 = shmctl(this->mShm,1,&local_98);
        if (iVar1 == -1) {
          shmctl(this->mShm,0,(shmid_ds *)0x0);
          this->mShm = -1;
          return 0;
        }
      }
      this->mKey = __key;
      this->mOwner = in_ECX != 0;
      this->mSize = in_EDX;
      return (int)CONCAT71((uint7)(uint3)((uint)in_ECX >> 8),1);
    }
  }
  return 0;
}

Assistant:

bool SharedMemory::init(key_t key, int size, CreateMode mode)
{
    if (key == -1)
        return false;

    mShm = shmget(key, size, (mode == None ? 0 : (IPC_CREAT | IPC_EXCL)));
    if (mShm == -1 && mode == Recreate) {
        mShm = shmget(key, size, 0);
        if (mShm != -1) {
            shmctl(mShm, IPC_RMID, 0);
            mShm = shmget(key, size, IPC_CREAT | IPC_EXCL);
        }
    }
    if (mShm == -1)
        return false;

    if (mode != None) {
        shmid_ds ds;
        memset(&ds, 0, sizeof(ds));
        ds.shm_perm.uid = getuid();
        ds.shm_perm.mode = 0600;
#ifdef HAVE_SHMDEST
        ds.shm_perm.mode |= SHM_DEST;
#endif
        const int ret = shmctl(mShm, IPC_SET, &ds);
        if (ret == -1) {
            shmctl(mShm, IPC_RMID, 0);
            mShm = -1;
            return false;
        }
    }
    mKey = key;
    mOwner = (mode != None);
    mSize = size;

    return true;
}